

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O0

void simd::Accumulate(Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height,
                     vector<unsigned_int,_std::allocator<unsigned_int>_> *result,SIMDType simdType)

{
  byte bVar1;
  uint32_t uVar2;
  int iVar3;
  uint32_t uVar4;
  size_type sVar5;
  undefined8 uVar6;
  uchar *puVar7;
  uint32_t in_ECX;
  int in_EDX;
  int in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  uint32_t in_R8D;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_R9;
  SIMDType in_stack_00000008;
  uint32_t nonSimdWidth;
  uint32_t totalSimdWidth;
  uint32_t simdWidth;
  uint32_t *outY;
  uint8_t *imageYEnd;
  uint8_t *imageY;
  uint32_t rowSize;
  uint8_t colorCount;
  uint32_t simdSize;
  uint32_t in_stack_000000d0;
  uint32_t in_stack_000000d4;
  uint32_t *in_stack_000000d8;
  uint8_t *in_stack_000000e0;
  uint8_t *in_stack_000000e8;
  uint32_t in_stack_000000f4;
  uint32_t in_stack_000001f0;
  uint32_t in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  uint32_t *in_stack_ffffffffffffff98;
  uint32_t in_stack_ffffffffffffffa0;
  uint32_t in_stack_ffffffffffffffa4;
  uint32_t in_stack_ffffffffffffffa8;
  uint32_t in_stack_ffffffffffffffac;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  imageException *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffcc;
  uint8_t *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  uint uVar8;
  uint32_t rowSize_00;
  
  uVar2 = getSimdSize(in_stack_00000008);
  bVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::colorCount(in_RDI);
  uVar8 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffd8);
  if ((in_stack_00000008 == cpu_function) || (in_ECX * in_R8D * (uint)bVar1 < uVar2)) {
    Image_Function::Accumulate
              ((Image *)CONCAT44(in_ESI,in_EDX),in_ECX,in_R8D,(uint32_t)((ulong)in_R9 >> 0x20),
               (uint32_t)in_R9,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)CONCAT44(uVar2,uVar8));
  }
  else {
    Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,
               in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0);
    Image_Function::VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>
              ((ImageTemplate<unsigned_char> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    iVar3 = in_ECX * (uVar8 >> 0x18);
    sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_R9);
    rowSize_00 = (uint32_t)((ulong)in_R9 >> 0x20);
    if (sVar5 != iVar3 * in_R8D) {
      uVar6 = __cxa_allocate_exception(0x28);
      imageException::imageException(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      __cxa_throw(uVar6,&imageException::typeinfo,imageException::~imageException);
    }
    Image_Function::OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>>
              ((uint32_t *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff98,
               (ImageTemplate<unsigned_char> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    uVar4 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RDI);
    puVar7 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RDI);
    puVar7 = puVar7 + (ulong)(in_ESI * (uVar8 >> 0x18)) + (ulong)(in_EDX * uVar4);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1356f3);
    if (in_stack_00000008 == avx_function) {
      avx::Accumulate(in_stack_000000f4,in_stack_000000e8,in_stack_000000e0,in_stack_000000d8,
                      in_stack_000000d4,in_stack_000000d0,in_stack_ffffffffffffff90);
    }
    else if (in_stack_00000008 == sse_function) {
      sse::Accumulate(rowSize_00,(uint8_t *)CONCAT44(uVar2,uVar8),in_stack_ffffffffffffffd0,
                      (uint32_t *)CONCAT44(in_stack_ffffffffffffffcc,uVar4),
                      (uint32_t)((ulong)puVar7 >> 0x20),(uint32_t)puVar7,in_stack_000001f0);
    }
  }
  return;
}

Assistant:

void Accumulate( const Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height, std::vector<uint32_t> & result, SIMDType simdType )
    {
        const uint32_t simdSize = getSimdSize( simdType );
        const uint8_t colorCount = image.colorCount();

        if( (simdType == cpu_function) || ((width * height * colorCount) < simdSize) ) {
            Image_Function::Accumulate(image, x, y, width, height, result);
            return;
        }

        Image_Function::ParameterValidation( image, x, y, width, height );
        Image_Function::VerifyGrayScaleImage( image );
        width = width * colorCount;

        if( result.size() != width * height )
            throw imageException( "Array size is not equal to image ROI (width * height) size" );

        Image_Function::OptimiseRoi( width, height, image );

        const uint32_t rowSize = image.rowSize();

        const uint8_t * imageY    = image.data() + y * rowSize + x * colorCount;
        const uint8_t * imageYEnd = imageY + height * rowSize;

        uint32_t * outY = result.data();

        const uint32_t simdWidth = width / simdSize;
        const uint32_t totalSimdWidth = simdWidth * simdSize;
        const uint32_t nonSimdWidth = width - totalSimdWidth;

        AVX_CODE( avx::Accumulate( rowSize, imageY, imageYEnd, outY, simdWidth, totalSimdWidth, nonSimdWidth ); )
        SSE_CODE( sse::Accumulate( rowSize, imageY, imageYEnd, outY, simdWidth, totalSimdWidth, nonSimdWidth ); )
        NEON_CODE( neon::Accumulate( rowSize, imageY, imageYEnd, outY, simdWidth, totalSimdWidth, nonSimdWidth ); )
    }